

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O2

size_t __thiscall wasm::WATParser::anon_unknown_10::LexCtx::startsWith(LexCtx *this,string_view sv)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view local_28;
  
  local_28 = next(this);
  __x = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_28,0,sv._M_len);
  bVar1 = std::operator==(__x,sv);
  return (ulong)bVar1;
}

Assistant:

size_t startsWith(std::string_view sv) const {
    return next().substr(0, sv.size()) == sv;
  }